

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::EscapeQuotes(string *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (str->_M_dataplus)._M_p;
  do {
    if (*pcVar1 == '\"') {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else if (*pcVar1 == '\0') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

std::string cmSystemTools::EscapeQuotes(const std::string& str)
{
  std::string result;
  result.reserve(str.size());
  for(const char* ch = str.c_str(); *ch != '\0'; ++ch)
    {
    if(*ch == '"')
      {
      result += '\\';
      }
    result += *ch;
    }
  return result;
}